

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O3

Entry * __thiscall
Lib::DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
findEntryToInsert(DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                  *this,VarSpec *key)

{
  uint uVar1;
  ulong uVar2;
  uint64_t uVar3;
  Entry *pEVar4;
  ulong uVar5;
  uint uVar6;
  
  if (this->_nextExpansionOccupancy <= this->_deleted + this->_size) {
    expand(this);
  }
  uVar2 = (key->_self)._content;
  uVar5 = (ulong)((uint)uVar2 * 0x40 + key->index + ((uint)(uVar2 >> 2) & 0x3fffffff) + 0x9e3779b9 ^
                 (uint)uVar2) % (ulong)(uint)this->_capacity;
  pEVar4 = this->_entries + (int)uVar5;
  uVar1 = this->_entries[(int)uVar5].field_0._infoData;
  if ((uVar1 >> 2 == this->_timestamp) &&
     (((pEVar4->_key)._self._content != uVar2 || ((pEVar4->_key).index != key->index)))) {
    (pEVar4->field_0)._infoData = uVar1 | 2;
    uVar1 = key->index;
    uVar3 = (key->_self)._content;
    uVar6 = ((int)uVar3 + (uVar1 >> 2) + uVar1 * 0x40 + 0x9e3779b9 ^ uVar1) % (uint)this->_capacity;
    do {
      uVar5 = (ulong)((int)uVar5 + uVar6 + (uVar6 == 0)) % (ulong)(uint)this->_capacity;
      pEVar4 = this->_entries + (int)uVar5;
      if ((uint)this->_entries[(int)uVar5].field_0._infoData >> 2 != this->_timestamp) {
        return pEVar4;
      }
    } while (((pEVar4->_key)._self._content != uVar3) || ((pEVar4->_key).index != uVar1));
  }
  return pEVar4;
}

Assistant:

Entry* findEntryToInsert(Key const& key)
  {
    ensureExpanded();
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    int pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp || res->_key==key) {
      return res;
    }

    //We have a collision...

    //mark the entry where the collision occured
    res->_info.collision=1;

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);
    return res;
  }